

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_send_error(http_s *r,size_t error)

{
  FIOBJ name;
  int iVar1;
  size_t sVar2;
  FIOBJ value;
  undefined1 local_58 [8];
  fio_str_info_s t;
  size_t pos;
  char buffer [16];
  uintptr_t local_20;
  size_t error_local;
  http_s *r_local;
  
  if ((r == (http_s *)0x0) || ((r->private_data).out_headers == 0)) {
    r_local._4_4_ = -1;
  }
  else {
    if ((error < 100) || (local_20 = error, 999 < error)) {
      local_20 = 500;
    }
    r->status = local_20;
    pos._0_1_ = 0x2f;
    sVar2 = fio_ltoa((char *)((long)&pos + 1),local_20,'\n');
    builtin_strncpy(buffer + sVar2 + -7,".html",5);
    t.data = (char *)(sVar2 + 6);
    *(char *)((long)&pos + (long)t.data) = '\0';
    iVar1 = http_sendfile2(r,*(char **)(*(long *)((r->private_data).flag + 0x38) + 0x28),
                           *(size_t *)(*(long *)((r->private_data).flag + 0x38) + 0x30),(char *)&pos
                           ,(size_t)t.data);
    name = HTTP_HEADER_CONTENT_TYPE;
    if (iVar1 != 0) {
      value = http_mimetype_find("txt",3);
      http_set_header(r,name,value);
      http_status2str((fio_str_info_s *)local_58,local_20);
      http_send_body(r,(void *)t.len,t.capa);
    }
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

int http_send_error(http_s *r, size_t error) {
  if (!r || !r->private_data.out_headers) {
    return -1;
  }
  if (error < 100 || error >= 1000)
    error = 500;
  r->status = error;
  char buffer[16];
  buffer[0] = '/';
  size_t pos = 1 + fio_ltoa(buffer + 1, error, 10);
  buffer[pos++] = '.';
  buffer[pos++] = 'h';
  buffer[pos++] = 't';
  buffer[pos++] = 'm';
  buffer[pos++] = 'l';
  buffer[pos] = 0;
  if (http_sendfile2(r, http2protocol(r)->settings->public_folder,
                     http2protocol(r)->settings->public_folder_length, buffer,
                     pos)) {
    http_set_header(r, HTTP_HEADER_CONTENT_TYPE,
                    http_mimetype_find((char *)"txt", 3));
    fio_str_info_s t = http_status2str(error);
    http_send_body(r, t.data, t.len);
  }
  return 0;
}